

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O2

void __thiscall
MT32Emu::BReverbModelImpl<short>::setParameters
          (BReverbModelImpl<short> *this,Bit8u time,Bit8u level)

{
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  CombFilter<short> *pCVar4;
  CombFilter<short> **ppCVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  BReverbSettings *pBVar9;
  Bit8u BVar10;
  Bit32u i;
  ulong uVar11;
  ulong uVar12;
  
  iVar6 = (*(this->super_BReverbModel)._vptr_BReverbModel[2])();
  if ((char)iVar6 != '\0') {
    uVar7 = level & 7;
    bVar8 = time & 7;
    bVar1 = this->tapDelayMode;
    if (bVar1 == false) {
      ppCVar5 = this->combs;
      pBVar9 = this->currentSettings;
      uVar3 = pBVar9->numberOfCombs;
      uVar12 = 8;
      for (uVar11 = 1; uVar11 < uVar3; uVar11 = uVar11 + 1) {
        *(Bit8u *)(*(long *)((long)ppCVar5 + uVar12) + 0x19) =
             pBVar9->feedbackFactors[uVar12 & 0xffffffff | (ulong)bVar8];
        uVar12 = uVar12 + 8;
      }
    }
    else {
      pBVar9 = this->currentSettings;
      pCVar4 = *this->combs;
      uVar2 = *(undefined4 *)((long)pBVar9->outRPositions + (ulong)((uint)bVar8 * 4));
      *(undefined4 *)&pCVar4->field_0x1c =
           *(undefined4 *)((long)pBVar9->outLPositions + (ulong)((uint)bVar8 * 4));
      *(undefined4 *)&pCVar4[1].super_RingBuffer<short>._vptr_RingBuffer = uVar2;
      pCVar4->feedbackFactor = pBVar9->feedbackFactors[5 < bVar8 && 2 < (byte)uVar7];
    }
    if (((level | time) & 7) == 0) {
      this->dryAmp = '\0';
      this->wetLevel = '\0';
    }
    else {
      if ((bVar1 == false) || (((ulong)bVar8 != 0 && ((byte)uVar7 != 1 || bVar8 != 1)))) {
        BVar10 = pBVar9->dryAmps[uVar7];
      }
      else {
        BVar10 = pBVar9->dryAmps[(ulong)uVar7 + 8];
      }
      this->dryAmp = BVar10;
      this->wetLevel = pBVar9->wetLevels[uVar7];
    }
  }
  return;
}

Assistant:

void setParameters(Bit8u time, Bit8u level) {
		if (!isOpen()) return;
		level &= 7;
		time &= 7;
		if (tapDelayMode) {
			TapDelayCombFilter<Sample> *comb = static_cast<TapDelayCombFilter<Sample> *> (*combs);
			comb->setOutputPositions(currentSettings.outLPositions[time], currentSettings.outRPositions[time & 7]);
			comb->setFeedbackFactor(currentSettings.feedbackFactors[((level < 3) || (time < 6)) ? 0 : 1]);
		} else {
			for (Bit32u i = 1; i < currentSettings.numberOfCombs; i++) {
				combs[i]->setFeedbackFactor(currentSettings.feedbackFactors[(i << 3) + time]);
			}
		}
		if (time == 0 && level == 0) {
			dryAmp = wetLevel = 0;
		} else {
			if (tapDelayMode && ((time == 0) || (time == 1 && level == 1))) {
				// Looks like MT-32 implementation has some minor quirks in this mode:
				// for odd level values, the output level changes sometimes depending on the time value which doesn't seem right.
				dryAmp = currentSettings.dryAmps[level + 8];
			} else {
				dryAmp = currentSettings.dryAmps[level];
			}
			wetLevel = currentSettings.wetLevels[level];
		}
	}